

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmyblas2.c
# Opt level: O1

void dmatvec(int ldm,int nrow,int ncol,double *M,double *vec,double *Mxvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  int iVar12;
  ulong uVar13;
  double *pdVar14;
  double *pdVar15;
  
  uVar9 = 0;
  if (7 < ncol) {
    lVar10 = (long)ldm;
    uVar9 = 0;
    do {
      if (0 < nrow) {
        dVar1 = vec[uVar9];
        dVar2 = vec[uVar9 + 1];
        dVar3 = vec[uVar9 + 2];
        dVar4 = vec[uVar9 + 3];
        dVar5 = vec[uVar9 + 4];
        dVar6 = vec[uVar9 + 5];
        dVar7 = vec[uVar9 + 6];
        dVar8 = vec[uVar9 + 7];
        uVar13 = 0;
        do {
          pdVar15 = M + uVar13;
          Mxvec[uVar13] =
               pdVar15[lVar10 * 7] * dVar8 +
               pdVar15[lVar10 * 6] * dVar7 +
               pdVar15[lVar10 * 5] * dVar6 +
               pdVar15[lVar10 * 4] * dVar5 +
               pdVar15[lVar10 * 3] * dVar4 +
               pdVar15[lVar10 * 2] * dVar3 + *pdVar15 * dVar1 + pdVar15[lVar10] * dVar2 +
               Mxvec[uVar13];
          uVar13 = uVar13 + 1;
        } while ((uint)nrow != uVar13);
      }
      uVar9 = uVar9 + 8;
      M = M + ldm * 8;
    } while ((long)uVar9 < (long)(ncol + -7));
  }
  if ((int)uVar9 < ncol + -3) {
    lVar10 = (long)ldm;
    iVar12 = ldm * 4;
    uVar9 = uVar9 & 0xffffffff;
    pdVar15 = M + lVar10 * 3;
    pdVar14 = M + lVar10;
    pdVar11 = M + lVar10 * 2;
    do {
      if (0 < nrow) {
        dVar1 = vec[uVar9];
        dVar2 = vec[uVar9 + 1];
        dVar3 = vec[uVar9 + 2];
        dVar4 = vec[uVar9 + 3];
        uVar13 = 0;
        do {
          Mxvec[uVar13] =
               pdVar15[uVar13] * dVar4 +
               pdVar11[uVar13] * dVar3 + M[uVar13] * dVar1 + pdVar14[uVar13] * dVar2 + Mxvec[uVar13]
          ;
          uVar13 = uVar13 + 1;
        } while ((uint)nrow != uVar13);
      }
      uVar9 = uVar9 + 4;
      M = M + iVar12;
      pdVar15 = pdVar15 + iVar12;
      pdVar11 = pdVar11 + iVar12;
      pdVar14 = pdVar14 + iVar12;
    } while ((long)uVar9 < (long)(ncol + -3));
  }
  if ((int)uVar9 < ncol) {
    uVar9 = uVar9 & 0xffffffff;
    do {
      if (0 < nrow) {
        dVar1 = vec[uVar9];
        uVar13 = 0;
        do {
          Mxvec[uVar13] = M[uVar13] * dVar1 + Mxvec[uVar13];
          uVar13 = uVar13 + 1;
        } while ((uint)nrow != uVar13);
      }
      uVar9 = uVar9 + 1;
      M = M + ldm;
    } while (uVar9 != (uint)ncol);
  }
  return;
}

Assistant:

void dmatvec (int ldm, int nrow, int ncol, double *M, double *vec, double *Mxvec)
{
    double vi0, vi1, vi2, vi3, vi4, vi5, vi6, vi7;
    double *M0;
    register double *Mki0, *Mki1, *Mki2, *Mki3, *Mki4, *Mki5, *Mki6, *Mki7;
    register int firstcol = 0;
    int k;

    M0 = &M[0];
    while ( firstcol < ncol - 7 ) {	/* Do 8 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
        Mki2 = Mki1 + ldm;
        Mki3 = Mki2 + ldm;
	Mki4 = Mki3 + ldm;
	Mki5 = Mki4 + ldm;
	Mki6 = Mki5 + ldm;
	Mki7 = Mki6 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	vi4 = vec[firstcol++];
	vi5 = vec[firstcol++];
	vi6 = vec[firstcol++];
	vi7 = vec[firstcol++];	

	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ 
		      + vi4 * *Mki4++ + vi5 * *Mki5++
		      + vi6 * *Mki6++ + vi7 * *Mki7++;

	M0 += 8 * ldm;
    }

    while ( firstcol < ncol - 3 ) {	/* Do 4 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
	Mki2 = Mki1 + ldm;
	Mki3 = Mki2 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ ;

	M0 += 4 * ldm;
    }

    while ( firstcol < ncol ) {		/* Do 1 column */

 	Mki0 = M0;
	vi0 = vec[firstcol++];
	for (k = 0; k < nrow; k++)
	    Mxvec[k] += vi0 * *Mki0++;

	M0 += ldm;
    }
	
}